

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iptables.c
# Opt level: O0

void print_tables(ip_tables_t *ipts)

{
  char *pcVar1;
  int local_14;
  int i;
  ip_tables_t *ipts_local;
  
  if (ipts != (ip_tables_t *)0x0) {
    for (local_14 = 0; local_14 < 4; local_14 = local_14 + 1) {
      if (ipts->tables[local_14] != (ip_table_t *)0x0) {
        printf("==================================================\n");
        pcVar1 = map_int_get_k(local_14,m_table);
        printf("Table %s\n",pcVar1);
        print_table(ipts->tables[local_14]);
      }
    }
    printf("==================================================\n");
  }
  return;
}

Assistant:

void print_tables(ip_tables_t *ipts)
{
	if (ipts == NULL) {
		return;
	}

	for (int i = 0; i < TABLE_MAX; i++) {
		if (ipts->tables[i] != NULL) {
			printf("==================================================\n");
			printf("Table %s\n", map_int_get_k(i, m_table));
			print_table(ipts->tables[i]);
		}
	}

	printf("==================================================\n");
}